

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBoxShape.h
# Opt level: O3

void __thiscall
btBoxShape::getPreferredPenetrationDirection
          (btBoxShape *this,int index,btVector3 *penetrationVector)

{
  btScalar bVar1;
  btScalar bVar2;
  ulong uVar3;
  
  if ((uint)index < 6) {
    uVar3 = (ulong)(uint)index;
    bVar1 = *(btScalar *)(&DAT_001f00b8 + uVar3 * 4);
    bVar2 = *(btScalar *)(&DAT_001f00d0 + uVar3 * 4);
    penetrationVector->m_floats[0] = *(btScalar *)(&DAT_001f00a0 + uVar3 * 4);
    penetrationVector->m_floats[1] = bVar1;
    penetrationVector->m_floats[2] = bVar2;
    penetrationVector->m_floats[3] = 0.0;
  }
  return;
}

Assistant:

virtual void	getPreferredPenetrationDirection(int index, btVector3& penetrationVector) const
	{
		switch (index)
		{
		case 0:
			penetrationVector.setValue(btScalar(1.),btScalar(0.),btScalar(0.));
			break;
		case 1:
			penetrationVector.setValue(btScalar(-1.),btScalar(0.),btScalar(0.));
			break;
		case 2:
			penetrationVector.setValue(btScalar(0.),btScalar(1.),btScalar(0.));
			break;
		case 3:
			penetrationVector.setValue(btScalar(0.),btScalar(-1.),btScalar(0.));
			break;
		case 4:
			penetrationVector.setValue(btScalar(0.),btScalar(0.),btScalar(1.));
			break;
		case 5:
			penetrationVector.setValue(btScalar(0.),btScalar(0.),btScalar(-1.));
			break;
		default:
			btAssert(0);
		}
	}